

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concur19.cc
# Opt level: O1

void __thiscall
tchecker::tck_reach::concur19::node_le_t::node_le_t
          (node_le_t *this,shared_ptr<tchecker::clockbounds::clockbounds_t> *clockbounds)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  clock_id_t cVar2;
  map_t *pmVar3;
  
  (this->_clockbounds).
  super___shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (clockbounds->
       super___shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (clockbounds->
           super___shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_clockbounds).
  super___shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  cVar2 = tchecker::clockbounds::global_lu_map_t::clock_number
                    ((((this->_clockbounds).
                       super___shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->_global_lu).
                     super___shared_ptr<tchecker::clockbounds::global_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  pmVar3 = tchecker::clockbounds::allocate_map((ulong)cVar2);
  this->_l = pmVar3;
  cVar2 = tchecker::clockbounds::global_lu_map_t::clock_number
                    ((((this->_clockbounds).
                       super___shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->_global_lu).
                     super___shared_ptr<tchecker::clockbounds::global_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  pmVar3 = tchecker::clockbounds::allocate_map((ulong)cVar2);
  this->_u = pmVar3;
  return;
}

Assistant:

node_le_t::node_le_t(std::shared_ptr<tchecker::clockbounds::clockbounds_t> const & clockbounds) : _clockbounds(clockbounds)
{
  _l = tchecker::clockbounds::allocate_map(_clockbounds->clocks_number());
  _u = tchecker::clockbounds::allocate_map(_clockbounds->clocks_number());
}